

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileParser::Q3BSPFileParser
          (Q3BSPFileParser *this,string *mapName,ZipArchiveIOSystem *pZipArchive)

{
  byte bVar1;
  bool bVar2;
  Q3BSPModel *pQVar3;
  ZipArchiveIOSystem *pZipArchive_local;
  string *mapName_local;
  Q3BSPFileParser *this_local;
  
  this->m_sOffset = 0;
  memset(&this->m_Data,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_Data);
  this->m_pModel = (Q3BSPModel *)0x0;
  this->m_pZipArchive = pZipArchive;
  if (this->m_pZipArchive == (ZipArchiveIOSystem *)0x0) {
    __assert_fail("nullptr != m_pZipArchive",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                  ,0x40,
                  "Assimp::Q3BSPFileParser::Q3BSPFileParser(const std::string &, ZipArchiveIOSystem *)"
                 );
  }
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) != 0) {
    bVar2 = readData(this,mapName);
    if (bVar2) {
      pQVar3 = (Q3BSPModel *)operator_new(0xe0);
      Q3BSP::Q3BSPModel::Q3BSPModel(pQVar3);
      this->m_pModel = pQVar3;
      std::__cxx11::string::operator=((string *)&this->m_pModel->m_ModelName,(string *)mapName);
      bVar2 = parseFile(this);
      if (!bVar2) {
        pQVar3 = this->m_pModel;
        if (pQVar3 != (Q3BSPModel *)0x0) {
          Q3BSP::Q3BSPModel::~Q3BSPModel(pQVar3);
          operator_delete(pQVar3,0xe0);
        }
        this->m_pModel = (Q3BSPModel *)0x0;
      }
    }
    return;
  }
  __assert_fail("!mapName.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0x41,
                "Assimp::Q3BSPFileParser::Q3BSPFileParser(const std::string &, ZipArchiveIOSystem *)"
               );
}

Assistant:

Q3BSPFileParser::Q3BSPFileParser( const std::string &mapName, ZipArchiveIOSystem *pZipArchive ) :
    m_sOffset( 0 ),
    m_Data(),
    m_pModel(nullptr),
    m_pZipArchive( pZipArchive )
{
    ai_assert(nullptr != m_pZipArchive );
    ai_assert( !mapName.empty() );

    if ( !readData( mapName ) )
        return;

    m_pModel = new Q3BSPModel;
    m_pModel->m_ModelName = mapName;
    if ( !parseFile() ) {
        delete m_pModel;
        m_pModel = nullptr;
    }
}